

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

int __thiscall asmjit::Zone::dup(Zone *this,int __fd)

{
  uint8_t *__dest;
  byte in_CL;
  size_t in_RDX;
  byte unaff_BPL;
  undefined4 in_register_00000034;
  uint8_t *puVar1;
  uint8_t *size;
  uint8_t *unaff_R15;
  
  puVar1 = (uint8_t *)CONCAT44(in_register_00000034,__fd);
  __dest = (uint8_t *)0x0;
  if ((puVar1 == (uint8_t *)0x0) || (in_RDX == 0)) goto LAB_0015dacf;
  if (in_RDX == 0xffffffffffffffff) {
    dup((int)this);
    size = puVar1;
    in_CL = unaff_BPL;
LAB_0015dae2:
    __dest = (uint8_t *)_alloc(this,(size_t)size);
  }
  else {
    __dest = this->_ptr;
    size = (uint8_t *)(in_CL + in_RDX);
    unaff_R15 = puVar1;
    if (this->_end + -(long)__dest < size) goto LAB_0015dae2;
    this->_ptr = size + (long)__dest;
    if (this->_end < size + (long)__dest) {
      dup((int)this);
    }
  }
  if (__dest == (uint8_t *)0x0) {
    __dest = (uint8_t *)0x0;
  }
  else {
    memcpy(__dest,unaff_R15,in_RDX);
    if (in_CL != 0) {
      __dest[in_RDX] = '\0';
    }
  }
LAB_0015dacf:
  return (int)__dest;
}

Assistant:

void* Zone::dup(const void* data, size_t size, bool nullTerminate) noexcept {
  if (ASMJIT_UNLIKELY(!data || !size)) return nullptr;

  ASMJIT_ASSERT(size != IntTraits<size_t>::maxValue());
  uint8_t* m = allocT<uint8_t>(size + nullTerminate);
  if (ASMJIT_UNLIKELY(!m)) return nullptr;

  ::memcpy(m, data, size);
  if (nullTerminate) m[size] = '\0';

  return static_cast<void*>(m);
}